

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *__buffer;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  pair<int_*,_long> pVar13;
  vector<int,_std::allocator<int>_> counts;
  void *mmioAddress;
  vector<int,_std::allocator<int>_> counterIndices;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> local_70;
  long local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined8 local_38;
  
  iVar2 = pci_system_init();
  if (iVar2 == 0) {
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0x1002;
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = 0xffffffff;
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = 0xffffffff;
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._4_4_ = 0xffffffff;
    local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xff000000030000;
    local_38 = 0;
    uVar3 = pci_id_match_iterator_create();
    do {
      lVar4 = pci_device_next(uVar3);
      if (lVar4 == 0) {
        pci_iterator_destroy(uVar3);
        pcVar8 = "could not find an AMD TONGA GPU\n";
        goto LAB_00102b0d;
      }
    } while ((*(ushort *)(lVar4 + 8) & 0xfffe) != 0x6938);
    pci_iterator_destroy(uVar3);
    iVar2 = pci_device_probe(lVar4);
    if (iVar2 == 0) {
      if (*(short *)(lVar4 + 6) == 0x1002) {
        iVar2 = pci_device_map_range(lVar4,*(undefined8 *)(lVar4 + 0xf0),0x40000,0,&local_58);
        if (iVar2 == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_50,
                     (DAT_00106148 - (anonymous_namespace)::counters >> 4) * -0x5555555555555555,
                     (allocator_type *)&local_70);
          lVar4 = CONCAT44(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,
                           local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_4_) -
                  CONCAT44(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_);
          if (lVar4 != 0) {
            lVar4 = lVar4 >> 2;
            lVar7 = 0;
            do {
              *(int *)(CONCAT44(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar7 * 4) = (int)lVar7;
              lVar7 = lVar7 + 1;
            } while (lVar4 + (ulong)(lVar4 == 0) != lVar7);
          }
          do {
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_70,
                       (DAT_00106148 - (anonymous_namespace)::counters >> 4) * -0x5555555555555555,
                       &local_71);
            iVar2 = 0;
            lVar4 = std::chrono::_V2::steady_clock::now();
            while (iVar2 != 100) {
              if ((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar7 = (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                pcVar8 = (char *)((anonymous_namespace)::counters + 0x28);
                lVar10 = 0;
                do {
                  if (((*(uint *)(pcVar8 + -4) &
                       *(uint *)(local_58 + (ulong)*(uint *)(pcVar8 + -8) * 4)) == 0) ==
                      (bool)*pcVar8) {
                    local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] =
                         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10] + 1;
                  }
                  lVar10 = lVar10 + 1;
                  pcVar8 = pcVar8 + 0x30;
                } while (lVar7 + (ulong)(lVar7 == 0) != lVar10);
              }
              lVar7 = std::chrono::_V2::steady_clock::now();
              auVar1 = SEXT816(lVar7 - lVar4) * SEXT816(-0x20c49ba5e353f7cf);
              iVar2 = iVar2 + 1;
              usleep(iVar2 * 10000 + ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)));
            }
            __first._M_current._4_4_ =
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
            __first._M_current._0_4_ =
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_;
            __last._M_current._4_4_ =
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
            __last._M_current._0_4_ =
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_;
            if (__first._M_current != __last._M_current) {
              lVar4 = (long)__last._M_current - (long)__first._M_current >> 2;
              pVar13 = std::get_temporary_buffer<int>((lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
              __buffer = pVar13.first;
              if (__buffer == (int *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          (__first,__last,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&local_70);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                          (__first,__last,__buffer,pVar13.second,
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_BNieuwenhuizen[P]amd_gpu_top_source_main_cpp:180:59)>
                            )&local_70);
              }
              operator_delete(__buffer);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[2J\x1b[1;1H",10);
            std::ostream::flush();
            if (DAT_00106148 != (anonymous_namespace)::counters) {
              uVar11 = 0;
              do {
                lVar4 = (anonymous_namespace)::counters;
                lVar7 = (long)*(int *)(CONCAT44(local_50.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_50.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      uVar11 * 4);
                lVar10 = lVar7 * 0x30;
                iVar2 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7];
                *(undefined8 *)(pci_device_next + *(long *)(std::cout + -0x18)) = 10;
                poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,*(char **)(lVar4 + lVar10),
                                    *(long *)(lVar4 + 8 + lVar10));
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 3;
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% ",2);
                iVar9 = iVar2 + 3;
                if (-1 < iVar2) {
                  iVar9 = iVar2;
                }
                *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0;
                iVar9 = iVar9 >> 2;
                iVar12 = iVar9;
                if (3 < iVar2) {
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,anon_var_dwarf_7e03,3);
                    iVar12 = iVar12 + -1;
                  } while (iVar12 != 0);
                }
                pcVar8 = (char *)(&(anonymous_namespace)::bars)[(iVar2 * 2) % 8];
                sVar6 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar8,sVar6);
                if (iVar2 < 0x7c) {
                  iVar2 = 0x1e;
                  if (0x1e < iVar9) {
                    iVar2 = iVar9;
                  }
                  iVar2 = (iVar2 - iVar9) + 1;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    iVar2 = iVar2 + -1;
                  } while (iVar2 != 0);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                uVar11 = uVar11 + 1;
              } while (uVar11 < (ulong)((DAT_00106148 - (anonymous_namespace)::counters >> 4) *
                                       -0x5555555555555555));
            }
            if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          } while( true );
        }
        pcVar8 = "mmio mem map failed (try to run as root)\n";
      }
      else {
        pcVar8 = "Graphics card is not identified\n";
      }
    }
    else {
      pcVar8 = "could not probe GPU\n";
    }
  }
  else {
    pcVar8 = "could not initialize PCI\n";
  }
LAB_00102b0d:
  std::operator<<((ostream *)&std::cerr,pcVar8);
  exit(1);
}

Assistant:

int main()
{
    auto dev = getPCIDevice(); // yes, we leak this
    int sampleCount = 100;

    void* mmioAddress;

    // TODO: better selection of region & size
    if(pci_device_map_range(dev, dev->regions[5].base_addr, 0x40000, 0, &mmioAddress)) {
        std::cerr << "mmio mem map failed (try to run as root)\n";
        std::exit(1);
    }

    std::vector<int> counterIndices(counters.size());
    for(std::size_t i = 0; i < counterIndices.size(); ++i)
        counterIndices[i] = i;

    for(;;) {

        std::vector<int> counts(counters.size());

        auto startTime = std::chrono::steady_clock::now();
        auto interval = 1000000 / sampleCount;

        for(int i = 0; i < sampleCount; ++i) {
            for(std::size_t i = 0; i < counts.size(); ++i) {
                if(counters[i].isIdle) {
                    if(!(readReg(mmioAddress, counters[i].index) & counters[i].mask))
                        ++counts[i];
                } else {
                    if(readReg(mmioAddress, counters[i].index) & counters[i].mask)
                        ++counts[i];
                }
            }

            auto currentTime = std::chrono::steady_clock::now();
            auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(currentTime - startTime);
            usleep((i + 1) * interval - elapsed.count());
        }

        std::stable_sort(
            counterIndices.begin(), counterIndices.end(), [&counts](int a, int b) { return counts[a] > counts[b]; });

        std::cout << "\033[2J\033[1;1H" << std::flush; // clears screen

        for(std::size_t i = 0; i < counters.size(); ++i) {
            printCounter(std::cout, counters[counterIndices[i]].name, counts[counterIndices[i]] * 100 / sampleCount);
            std::cout << "\n";
        }
    }
}